

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::uploadTexture
               (CallLogWrapper *glLog,LayeredImage *src,deUint32 textureBufGL)

{
  GLsizei GVar1;
  GLsizei GVar2;
  GLsizei depth;
  int iVar3;
  deUint32 internalFormat;
  uint uVar4;
  int iVar5;
  TransferFormat TVar6;
  GLint param;
  long lVar7;
  GLenum GVar8;
  int faceI;
  ulong uVar9;
  GLenum *pGVar10;
  GLenum format;
  GLenum type;
  PixelBufferAccess local_58;
  
  internalFormat = glu::getInternalFormat(src->m_format);
  TVar6 = glu::getTransferFormat(src->m_format);
  setTextureStorage(glLog,src->m_type,internalFormat,&src->m_size,textureBufGL);
  uVar4 = tcu::TextureFormat::getPixelSize(&src->m_format);
  param = 8;
  if ((uVar4 & uVar4 - 1) != 0) {
    param = 1;
  }
  glu::CallLogWrapper::glPixelStorei(glLog,0xcf5,param);
  format = TVar6.format;
  type = TVar6.dataType;
  switch(src->m_type) {
  case TEXTURETYPE_2D:
    GVar1 = (src->m_size).m_data[0];
    GVar2 = (src->m_size).m_data[1];
    LayeredImage::getAccessInternal(&local_58,src);
    glu::CallLogWrapper::glTexSubImage2D
              (glLog,0xde1,0,0,0,GVar1,GVar2,format,type,
               local_58.super_ConstPixelBufferAccess.m_data);
    return;
  case TEXTURETYPE_CUBE:
    pGVar10 = &DAT_01c9b22c;
    lVar7 = 0x28;
    uVar9 = 0;
    do {
      GVar8 = 0;
      if (uVar9 < 6) {
        GVar8 = *pGVar10;
      }
      glu::CallLogWrapper::glTexSubImage2D
                (glLog,GVar8,0,0,0,(src->m_size).m_data[0],(src->m_size).m_data[1],format,type,
                 *(void **)(*(long *)((long)((src->m_texCube).m_ptr)->m_data + lVar7 * 4 + -0x10) +
                           0x20));
      uVar9 = uVar9 + 1;
      pGVar10 = pGVar10 + 1;
      lVar7 = lVar7 + 6;
    } while (uVar9 != 6);
    return;
  case TEXTURETYPE_2D_ARRAY:
    GVar8 = 0x8c1a;
    break;
  case TEXTURETYPE_3D:
    GVar8 = 0x806f;
    break;
  default:
    GVar8 = 0xffffffff;
    break;
  case TEXTURETYPE_BUFFER:
    glu::CallLogWrapper::glBindBuffer(glLog,0x8c2a,textureBufGL);
    iVar5 = tcu::TextureFormat::getPixelSize(&src->m_format);
    iVar3 = (src->m_size).m_data[0];
    LayeredImage::getAccessInternal(&local_58,src);
    glu::CallLogWrapper::glBufferData
              (glLog,0x8c2a,(long)(iVar5 * iVar3),local_58.super_ConstPixelBufferAccess.m_data,
               0x88e4);
    return;
  }
  GVar1 = (src->m_size).m_data[0];
  GVar2 = (src->m_size).m_data[1];
  depth = (src->m_size).m_data[2];
  LayeredImage::getAccessInternal(&local_58,src);
  glu::CallLogWrapper::glTexSubImage3D
            (glLog,GVar8,0,0,0,0,GVar1,GVar2,depth,format,type,
             local_58.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

static void uploadTexture (glu::CallLogWrapper& glLog, const LayeredImage& src, deUint32 textureBufGL)
{
	const deUint32				internalFormat	= glu::getInternalFormat(src.getFormat());
	const glu::TransferFormat	transferFormat	= glu::getTransferFormat(src.getFormat());
	const IVec3&				imageSize		= src.getSize();

	setTextureStorage(glLog, src.getImageType(), internalFormat, imageSize, textureBufGL);

	{
		const int	pixelSize = src.getFormat().getPixelSize();
		int			unpackAlignment;

		if (deIsPowerOfTwo32(pixelSize))
			unpackAlignment = 8;
		else
			unpackAlignment = 1;

		glLog.glPixelStorei(GL_UNPACK_ALIGNMENT, unpackAlignment);
	}

	if (src.getImageType() == TEXTURETYPE_BUFFER)
	{
		glLog.glBindBuffer(GL_TEXTURE_BUFFER, textureBufGL);
		glLog.glBufferData(GL_TEXTURE_BUFFER, src.getFormat().getPixelSize() * imageSize.x(), src.getAccess().getDataPtr(), GL_STATIC_DRAW);
	}
	else if (src.getImageType() == TEXTURETYPE_2D)
		glLog.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageSize.x(), imageSize.y(), transferFormat.format, transferFormat.dataType, src.getAccess().getDataPtr());
	else if (src.getImageType() == TEXTURETYPE_CUBE)
	{
		for (int faceI = 0; faceI < tcu::CUBEFACE_LAST; faceI++)
		{
			const tcu::CubeFace face = (tcu::CubeFace)faceI;
			glLog.glTexSubImage2D(cubeFaceToGLFace(face), 0, 0, 0, imageSize.x(), imageSize.y(), transferFormat.format, transferFormat.dataType, src.getCubeFaceAccess(face).getDataPtr());
		}
	}
	else
	{
		DE_ASSERT(src.getImageType() == TEXTURETYPE_3D || src.getImageType() == TEXTURETYPE_2D_ARRAY);
		const deUint32 textureTarget = getGLTextureTarget(src.getImageType());
		glLog.glTexSubImage3D(textureTarget, 0, 0, 0, 0, imageSize.x(), imageSize.y(), imageSize.z(), transferFormat.format, transferFormat.dataType, src.getAccess().getDataPtr());
	}
}